

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  ImGuiStoragePair *pIVar1;
  ulong uVar2;
  ImGuiStoragePair *pIVar3;
  ulong uVar4;
  ulong uVar5;
  
  pIVar1 = (this->Data).Data;
  uVar4 = (ulong)(this->Data).Size;
  pIVar3 = pIVar1;
  uVar5 = uVar4;
  while (uVar2 = uVar5, uVar2 != 0) {
    uVar5 = uVar2 >> 1;
    if (pIVar3[uVar5].key < key) {
      pIVar3 = pIVar3 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar2;
    }
  }
  if ((pIVar3 != pIVar1 + uVar4) && (pIVar3->key == key)) {
    default_val = (pIVar3->field_1).val_i;
  }
  return default_val;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImGuiStoragePair* it = LowerBound(const_cast<ImVector<ImGuiStoragePair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}